

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O2

bool __thiscall Uniforms::addSequence(Uniforms *this,string *_name,string *_filename)

{
  pointer pUVar1;
  pointer pUVar2;
  istream *piVar3;
  mapped_type *this_00;
  vector<UniformData,_std::allocator<UniformData>_> uniform_data_sequence;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string line;
  UniformData data;
  ifstream infile;
  
  uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::ifstream::ifstream(&infile,(string *)_filename,_S_in);
  std::__cxx11::string::string((string *)&line,"",(allocator *)&data);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&infile,(string *)&line);
    pUVar2 = uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pUVar1 = uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    if (line._M_string_length != 0) {
      vera::split(&values,&line,',',true);
      if (values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        UniformData::UniformData(&data);
        UniformData::parse(&data,&values,0,false);
        std::vector<UniformData,_std::allocator<UniformData>_>::push_back
                  (&uniform_data_sequence,&data);
        std::_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
        ~_Deque_base((_Deque_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                      *)&data);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&values);
    }
  }
  if (uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      uniform_data_sequence.super__Vector_base<UniformData,_std::allocator<UniformData>_>._M_impl.
      super__Vector_impl_data._M_start) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniformData,_std::allocator<UniformData>_>_>_>_>
              ::operator[](&this->sequences,_name);
    std::vector<UniformData,_std::allocator<UniformData>_>::operator=
              (this_00,&uniform_data_sequence);
  }
  std::__cxx11::string::~string((string *)&line);
  std::ifstream::~ifstream(&infile);
  std::vector<UniformData,_std::allocator<UniformData>_>::~vector(&uniform_data_sequence);
  return pUVar2 != pUVar1;
}

Assistant:

bool Uniforms::addSequence( const std::string& _name, const std::string& _filename) {
    std::vector<UniformData> uniform_data_sequence;

    // Open file _filename and read all lines
    std::ifstream infile(_filename);
    std::string line = "";
    while (std::getline(infile, line)) {
        if (line.size() > 0) {
            std::vector<std::string> values = vera::split(line,',', true);
            if (values.size() > 0) {
                UniformData data;
                data.parse(values, 0, false);
                uniform_data_sequence.push_back(data);
            }
        }
    }

    // std::cout << "Load " << _name << " from " << _filename <<  " with " << uniform_data_sequence.size() << " values" << std::endl;
    if (uniform_data_sequence.size() == 0)
        return false;

    sequences[_name] = uniform_data_sequence;

    return true;
}